

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlNodeDumpFileFormat(FILE *out,xmlDocPtr doc,xmlNodePtr cur,char *encoding,int format)

{
  xmlCharEncoding xVar1;
  xmlOutputBufferPtr buf_00;
  xmlCharEncoding enc;
  int ret;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  int format_local;
  char *encoding_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  FILE *out_local;
  
  _enc = (xmlCharEncodingHandlerPtr)0x0;
  xmlInitParser();
  if (encoding == (char *)0x0) {
    _enc = xmlFindCharEncodingHandler("HTML");
    if (_enc == (xmlCharEncodingHandlerPtr)0x0) {
      _enc = xmlFindCharEncodingHandler("ascii");
    }
  }
  else {
    xVar1 = xmlParseCharEncoding(encoding);
    if ((xVar1 != XML_CHAR_ENCODING_UTF8) &&
       (_enc = xmlFindCharEncodingHandler(encoding), _enc == (xmlCharEncodingHandlerPtr)0x0)) {
      htmlSaveErr(0x57b,(xmlNodePtr)0x0,encoding);
    }
  }
  buf_00 = xmlOutputBufferCreateFile(out,_enc);
  if (buf_00 == (xmlOutputBufferPtr)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    htmlNodeDumpFormatOutput(buf_00,doc,cur,(char *)0x0,format);
    out_local._4_4_ = xmlOutputBufferClose(buf_00);
  }
  return out_local._4_4_;
}

Assistant:

int
htmlNodeDumpFileFormat(FILE *out, xmlDocPtr doc,
	               xmlNodePtr cur, const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    xmlInitParser();

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFile(out, handler);
    if (buf == NULL) return(0);

    htmlNodeDumpFormatOutput(buf, doc, cur, NULL, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}